

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIOGetTypedIntArray(FmsIOContext *ctx,char *path,FmsIntType *type,void **values,FmsInt *n)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulonglong uVar5;
  int *piVar6;
  intmax_t iVar7;
  void *pvVar8;
  size_t sVar9;
  uintmax_t uVar10;
  ulong uVar11;
  ulong uVar12;
  char *newoff;
  char v [512];
  char k [512];
  char *local_450;
  ulong local_448;
  size_t *local_440;
  char local_438 [512];
  char local_238 [520];
  
  if (ctx == (FmsIOContext *)0x0) {
    return 1;
  }
  if (path == (char *)0x0) {
    iVar3 = 2;
  }
  else if (type == (FmsIntType *)0x0) {
    iVar3 = 3;
  }
  else if (values == (void **)0x0) {
    iVar3 = 4;
  }
  else if (n == (FmsInt *)0x0) {
    iVar3 = 5;
  }
  else {
    iVar2 = FmsIOReadKeyValue((FmsIOContext *)ctx->fp,local_238,local_438);
    iVar3 = 6;
    if (iVar2 == 0) {
      local_440 = n;
      pcVar4 = join_keys(path,"Size");
      iVar2 = strcmp(local_238,pcVar4);
      if (pcVar4 != (char *)0x0) {
        free(pcVar4);
      }
      psVar1 = local_440;
      iVar3 = 7;
      if (iVar2 == 0) {
        uVar5 = strtoull(local_438,(char **)0x0,10);
        *psVar1 = uVar5;
        piVar6 = __errno_location();
        if (*piVar6 == 0x22) {
          iVar3 = 8;
        }
        else if (*piVar6 == 0x16) {
          iVar3 = 9;
        }
        else {
          iVar2 = FmsIOReadKeyValue((FmsIOContext *)ctx->fp,local_238,local_438);
          iVar3 = 10;
          if (iVar2 == 0) {
            pcVar4 = join_keys(path,"Type");
            iVar2 = strcmp(local_238,pcVar4);
            if (pcVar4 != (char *)0x0) {
              free(pcVar4);
            }
            psVar1 = local_440;
            iVar3 = 0xb;
            if (iVar2 == 0) {
              iVar2 = FmsGetIntTypeFromName(local_438,type);
              iVar3 = 0xc;
              if (iVar2 == 0) {
                if (*psVar1 != 0) {
                  iVar3 = FmsIOReadKeyValue((FmsIOContext *)ctx->fp,local_238,local_438);
                  if (iVar3 != 0) {
                    return 0xe;
                  }
                  pcVar4 = join_keys(path,"Values");
                  iVar3 = strcmp(local_238,pcVar4);
                  if (pcVar4 != (char *)0x0) {
                    free(pcVar4);
                  }
                  if (iVar3 != 0) {
                    return 0xf;
                  }
                  switch(*type) {
                  case FMS_INT8:
                    pvVar8 = malloc(*local_440);
                    local_448 = 0;
                    do {
                      uVar11 = local_448;
                      sVar9 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar12 = local_448;
                        if ((sVar9 == 0) || (uVar12 = uVar11, *local_440 <= uVar11)) break;
                        iVar7 = strtoimax(pcVar4,&local_450,10);
                        *(char *)((long)pvVar8 + uVar11) = (char)iVar7;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar11 = uVar11 + 1;
                        uVar12 = uVar11;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar9);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar12, iVar3 == 0));
                    break;
                  case FMS_INT16:
                    pvVar8 = malloc(*local_440 * 2);
                    local_448 = 0;
                    do {
                      uVar11 = local_448;
                      sVar9 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar12 = local_448;
                        if ((sVar9 == 0) || (uVar12 = uVar11, *local_440 <= uVar11)) break;
                        iVar7 = strtoimax(pcVar4,&local_450,10);
                        *(short *)((long)pvVar8 + uVar11 * 2) = (short)iVar7;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar11 = uVar11 + 1;
                        uVar12 = uVar11;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar9);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar12, iVar3 == 0));
                    break;
                  case FMS_INT32:
                    pvVar8 = malloc(*local_440 << 2);
                    local_448 = 0;
                    do {
                      uVar11 = local_448;
                      sVar9 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar12 = local_448;
                        if ((sVar9 == 0) || (uVar12 = uVar11, *local_440 <= uVar11)) break;
                        iVar7 = strtoimax(pcVar4,&local_450,10);
                        *(int *)((long)pvVar8 + uVar11 * 4) = (int)iVar7;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar11 = uVar11 + 1;
                        uVar12 = uVar11;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar9);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar12, iVar3 == 0));
                    break;
                  case FMS_INT64:
                    pvVar8 = malloc(*local_440 << 3);
                    local_448 = 0;
                    do {
                      uVar11 = local_448;
                      sVar9 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar12 = local_448;
                        if ((sVar9 == 0) || (uVar12 = uVar11, *local_440 <= uVar11)) break;
                        iVar7 = strtoimax(pcVar4,&local_450,10);
                        *(intmax_t *)((long)pvVar8 + uVar11 * 8) = iVar7;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar11 = uVar11 + 1;
                        uVar12 = uVar11;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar9);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar12, iVar3 == 0));
                    break;
                  case FMS_ORIENTATION_INT_TYPE:
                    pvVar8 = malloc(*local_440);
                    local_448 = 0;
                    do {
                      uVar11 = local_448;
                      sVar9 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar12 = local_448;
                        if ((sVar9 == 0) || (uVar12 = uVar11, *local_440 <= uVar11)) break;
                        uVar10 = strtoumax(pcVar4,&local_450,10);
                        *(char *)((long)pvVar8 + uVar11) = (char)uVar10;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar11 = uVar11 + 1;
                        uVar12 = uVar11;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar9);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar12, iVar3 == 0));
                    break;
                  case FMS_UINT16:
                    pvVar8 = malloc(*local_440 * 2);
                    local_448 = 0;
                    do {
                      uVar11 = local_448;
                      sVar9 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar12 = local_448;
                        if ((sVar9 == 0) || (uVar12 = uVar11, *local_440 <= uVar11)) break;
                        uVar10 = strtoumax(pcVar4,&local_450,10);
                        *(short *)((long)pvVar8 + uVar11 * 2) = (short)uVar10;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar11 = uVar11 + 1;
                        uVar12 = uVar11;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar9);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar12, iVar3 == 0));
                    break;
                  case FMS_UINT32:
                    pvVar8 = malloc(*local_440 << 2);
                    local_448 = 0;
                    do {
                      uVar11 = local_448;
                      sVar9 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar12 = local_448;
                        if ((sVar9 == 0) || (uVar12 = uVar11, *local_440 <= uVar11)) break;
                        uVar10 = strtoumax(pcVar4,&local_450,10);
                        *(int *)((long)pvVar8 + uVar11 * 4) = (int)uVar10;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar11 = uVar11 + 1;
                        uVar12 = uVar11;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar9);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar12, iVar3 == 0));
                    break;
                  case FMS_INT_TYPE:
                    pvVar8 = malloc(*local_440 << 3);
                    local_448 = 0;
                    do {
                      uVar11 = local_448;
                      sVar9 = strlen(local_438);
                      local_450 = (char *)0x0;
                      pcVar4 = local_438 + (local_438[0] == '[');
                      do {
                        uVar12 = local_448;
                        if ((sVar9 == 0) || (uVar12 = uVar11, *local_440 <= uVar11)) break;
                        uVar10 = strtoumax(pcVar4,&local_450,10);
                        *(uintmax_t *)((long)pvVar8 + uVar11 * 8) = uVar10;
                        pcVar4 = local_450 + 1;
                        if (local_450[1] == ' ') {
                          pcVar4 = local_450 + 2;
                        }
                        uVar11 = uVar11 + 1;
                        uVar12 = uVar11;
                        local_450 = pcVar4;
                      } while (pcVar4 < local_438 + sVar9);
                      pcVar4 = strchr(local_438,0x5d);
                    } while ((pcVar4 == (char *)0x0) &&
                            (iVar3 = FmsIOReadLine(ctx,local_438), local_448 = uVar12, iVar3 == 0));
                    break;
                  default:
                    return 0x10;
                  }
                  *values = pvVar8;
                }
                iVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
FmsIOGetTypedIntArray(FmsIOContext *ctx, const char *path, FmsIntType *type,
                      void **values, FmsInt *n) {
  int err = 0;
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!type) E_RETURN(3);
  if(!values) E_RETURN(4);
  if(!n) E_RETURN(5);

  /* Arrays are written like:
      path/Size: n
      path/Type: type
      path/Values: [1,2,3,
      4,5,6
      7,8,9]
  */

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(6);

    char *ksize = join_keys(path, "Size");
    err = strcmp(k, ksize);
    FREE(ksize);
    // Path & key didn't match
    if(err)
      E_RETURN(7);

    *n = StrToFmsInt(v, NULL, 10);

    if (errno == ERANGE) { E_RETURN(8); }
    if (errno == EINVAL) { E_RETURN(9); }
  }

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(10);

    char *ktype= join_keys(path, "Type");
    err = strcmp(k, ktype);
    FREE(ktype);
    // Path & key didn't match
    if(err)
      E_RETURN(11);

    if(FmsGetIntTypeFromName(v, type))
      E_RETURN(12);
  }

  // Values does not get written if Size == 0
  if(*n == 0)
    return 0;

  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(14);

  char *kvalues = join_keys(path, "Values");
  err = strcmp(k, kvalues);
  FREE(kvalues);
  if(err)
    E_RETURN(15);

#define READ_ARRAY_DATA(DEST_T, FUNC) \
do { \
    DEST_T *data = malloc(sizeof(DEST_T) * *n); \
    FmsInt i = 0; \
    while(1) { \
        size_t len = strlen(v); \
        char *off = v, *newoff = NULL; \
        if(off[0] == '[') \
            off++; \
        while(len && i < *n) { \
            data[i++] = (DEST_T)FUNC(off, &newoff, 10); \
            newoff++; \
            if(*newoff == ' ') newoff++; /* Current flaw in the file format, last element has no trialing space */ \
            if(newoff >= v + len) break; \
            off = newoff; \
        }